

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderVariableManagerVk.cpp
# Opt level: O3

PipelineResourceDesc * __thiscall
Diligent::ShaderVariableManagerVk::GetResourceDesc(ShaderVariableManagerVk *this,Uint32 Index)

{
  PipelineResourceDesc *pPVar1;
  char (*in_RCX) [13];
  PipelineResourceSignatureType *this_00;
  string msg;
  string local_38;
  
  this_00 = (this->
            super_ShaderVariableManagerBase<Diligent::EngineVkImplTraits,_Diligent::ShaderVariableVkImpl>
            ).m_pSignature;
  if (this_00 == (PipelineResourceSignatureType *)0x0) {
    FormatString<char[26],char[13]>
              (&local_38,(Diligent *)"Debug expression failed:\n",(char (*) [26])"m_pSignature",
               in_RCX);
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"GetResourceDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVariableManagerVk.cpp"
               ,0xa2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    this_00 = (this->
              super_ShaderVariableManagerBase<Diligent::EngineVkImplTraits,_Diligent::ShaderVariableVkImpl>
              ).m_pSignature;
  }
  pPVar1 = PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::GetResourceDesc
                     (&this_00->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>,
                      Index);
  return pPVar1;
}

Assistant:

const PipelineResourceDesc& ShaderVariableManagerVk::GetResourceDesc(Uint32 Index) const
{
    VERIFY_EXPR(m_pSignature);
    return m_pSignature->GetResourceDesc(Index);
}